

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp128.hpp
# Opt level: O0

uint duckdb::Chimp128Decompression<unsigned_int>::LoadFirst(DecompressState *state)

{
  uint uVar1;
  long in_RDI;
  uint result;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  uVar1 = BitReader::ReadValue<unsigned_int,(unsigned_char)32>
                    ((BitReader *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  RingBuffer<unsigned_int>::InsertScan<true>
            ((RingBuffer<unsigned_int> *)(in_RDI + 0x18),(ulong)uVar1);
  *(undefined1 *)(in_RDI + 0x10420) = 0;
  *(uint *)(in_RDI + 0x14) = uVar1;
  return uVar1;
}

Assistant:

static inline CHIMP_TYPE LoadFirst(DecompressState &state) {
		CHIMP_TYPE result = state.input.template ReadValue<CHIMP_TYPE, sizeof(CHIMP_TYPE) * 8>();
		state.ring_buffer.template InsertScan<true>(result);
		state.first = false;
		state.reference_value = result;
		return result;
	}